

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console_Command.h
# Opt level: O2

void __thiscall
Generic_Command_As_Console_Command<IRCConnectGenericCommand>::trigger
          (Generic_Command_As_Console_Command<IRCConnectGenericCommand> *this,string_view parameters
          )

{
  ostream *poVar1;
  unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  response_line;
  __uniq_ptr_impl<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  local_20;
  
  local_20._M_t.
  super__Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  .super__Head_base<0UL,_Jupiter::GenericCommand::ResponseLine_*,_false>._M_head_impl =
       (tuple<Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
        )(**(code **)(IRCConnectGenericCommand_instance.super_IRCConnectGenericCommand._0_8_ + 0x18)
         )(&IRCConnectGenericCommand_instance,parameters._M_len,parameters._M_str);
  while ((_Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
          )local_20._M_t.
           super__Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
           .super__Head_base<0UL,_Jupiter::GenericCommand::ResponseLine_*,_false>._M_head_impl !=
         (ResponseLine *)0x0) {
    poVar1 = (ostream *)&std::cout;
    if ((*(uint *)((long)local_20._M_t.
                         super__Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
                         .super__Head_base<0UL,_Jupiter::GenericCommand::ResponseLine_*,_false>.
                         _M_head_impl + 0x20) & 0xfffffffe) == 2) {
      poVar1 = (ostream *)&std::cerr;
    }
    poVar1 = std::operator<<(poVar1,(string *)
                                    local_20._M_t.
                                    super__Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
                                    .
                                    super__Head_base<0UL,_Jupiter::GenericCommand::ResponseLine_*,_false>
                                    ._M_head_impl);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::
    __uniq_ptr_impl<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
    ::reset(&local_20,
            *(pointer *)
             ((long)local_20._M_t.
                    super__Tuple_impl<0UL,_Jupiter::GenericCommand::ResponseLine_*,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
                    .super__Head_base<0UL,_Jupiter::GenericCommand::ResponseLine_*,_false>.
                    _M_head_impl + 0x28));
  }
  std::
  unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
  ::~unique_ptr((unique_ptr<Jupiter::GenericCommand::ResponseLine,_std::default_delete<Jupiter::GenericCommand::ResponseLine>_>
                 *)&local_20);
  return;
}

Assistant:

void Generic_Command_As_Console_Command<T>::trigger(std::string_view parameters) {
	std::unique_ptr<Jupiter::GenericCommand::ResponseLine> response_line{ T::instance.trigger(parameters) };
	while (response_line != nullptr) {
		auto& out_stream = response_line->type == Jupiter::GenericCommand::DisplayType::PublicError
			|| response_line->type == Jupiter::GenericCommand::DisplayType::PrivateError ? std::cerr : std::cout;

		out_stream << response_line->response << std::endl;
		response_line.reset(response_line->next);
	}
}